

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O2

void __thiscall
FileHandlePool::FileHandlePool
          (FileHandlePool *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenames,int count)

{
  FileHandlePool *pFVar1;
  fdb_status fVar2;
  reference pvVar3;
  StatAggregator *this_00;
  ulong uVar4;
  ulong uVar5;
  fdb_file_handle *dbfile;
  FileHandlePool *local_158;
  PoolEntry *pe;
  fdb_kvs_handle *db;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  
  this->_vptr_FileHandlePool = (_func_int **)&PTR__FileHandlePool_00156ce0;
  (this->pool_vector).super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pool_vector).super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pool_vector).super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fdb_get_default_config();
  fconfig.multi_kv_instances = false;
  fdb_get_default_kvs_config();
  uVar4 = 0;
  uVar5 = (ulong)(uint)count;
  if (count < 1) {
    uVar5 = uVar4;
  }
  local_158 = this;
  for (; pFVar1 = local_158, uVar5 != uVar4; uVar4 = uVar4 + 1) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(filenames,
                  uVar4 % (ulong)((long)(filenames->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(filenames->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 5));
    fVar2 = fdb_open(&dbfile,(pvVar3->_M_dataplus)._M_p,&fconfig);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fdb_assert_die("status == FDB_RESULT_SUCCESS",
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                     ,0x56,(long)fVar2,0);
    }
    fVar2 = fdb_kvs_open_default(dbfile,&db,&kvs_config);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fdb_assert_die("status == FDB_RESULT_SUCCESS",
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                     ,0x58,(long)fVar2,0);
    }
    pe = (PoolEntry *)operator_new(0x18);
    pe->index = (int)uVar4;
    LOCK();
    (pe->available)._M_base._M_i = true;
    UNLOCK();
    pe->dbfile = dbfile;
    pe->db = db;
    std::vector<PoolEntry_*,_std::allocator<PoolEntry_*>_>::push_back(&this->pool_vector,&pe);
  }
  pthread_mutex_init((pthread_mutex_t *)&local_158->statlock,(pthread_mutexattr_t *)0x0);
  this_00 = (StatAggregator *)operator_new(0x10);
  StatAggregator::StatAggregator(this_00,9,1);
  pFVar1->sa = this_00;
  std::__cxx11::string::assign((char *)*this_00->t_stats);
  std::__cxx11::string::assign((char *)pFVar1->sa->t_stats[1]);
  std::__cxx11::string::assign((char *)pFVar1->sa->t_stats[2]);
  std::__cxx11::string::assign((char *)pFVar1->sa->t_stats[3]);
  std::__cxx11::string::assign((char *)pFVar1->sa->t_stats[5]);
  std::__cxx11::string::assign((char *)pFVar1->sa->t_stats[7]);
  std::__cxx11::string::assign((char *)pFVar1->sa->t_stats[8]);
  pFVar1->samples = 0;
  return;
}

Assistant:

FileHandlePool(std::vector<std::string> filenames, int count) {
        fdb_status status;
        fdb_config fconfig = fdb_get_default_config();
        fconfig.multi_kv_instances = false;
        fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
        for (int i = 0; i < count; ++i) {
            fdb_file_handle *dbfile;
            fdb_kvs_handle *db;
            status = fdb_open(&dbfile,
                              filenames.at(i % filenames.size()).c_str(),
                              &fconfig);
            fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);
            status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
            fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);
            PoolEntry *pe = new PoolEntry(i, true, dbfile, db);
            pool_vector.push_back(pe);
        }

        mutex_init(&statlock);

        // Set up StatAggregator
        sa = new StatAggregator(_num_stats_, 1);

        sa->t_stats[SET][0].name = "set";
        sa->t_stats[COMMIT][0].name = "commit";
        sa->t_stats[GET][0].name = "get";
        sa->t_stats[IN_MEM_SNAP][0].name = "in-mem snapshot";

        sa->t_stats[ITR_INIT][0].name = "iterator-init";
        sa->t_stats[ITR_GET][0].name = "iterator-get";
        sa->t_stats[ITR_CLOSE][0].name = "iterator-close";

        samples = 0;
    }